

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

_Bool ConnectionExists(Curl_easy *data,connectdata *needle,connectdata **usethis,_Bool *force_reuse,
                      _Bool *waitpipe)

{
  ssl_connection_state sVar1;
  connectdata *conn;
  bool bVar2;
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  uint uVar6;
  curlntlm cVar7;
  connectbundle *pcVar8;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  curltime cVar14;
  curltime now_00;
  char *local_a0;
  size_t multiplexed;
  curl_llist_element *pcStack_78;
  _Bool match;
  curl_llist_element *curr;
  _Bool wantProxyNTLMhttp;
  _Bool wantNTLMhttp;
  curltime now;
  connectbundle *bundle;
  _Bool canmultiplex;
  connectdata *pcStack_48;
  _Bool foundPendingCandidate;
  connectdata *chosen;
  connectdata *check;
  _Bool *waitpipe_local;
  _Bool *force_reuse_local;
  connectdata **usethis_local;
  connectdata *needle_local;
  Curl_easy *data_local;
  
  pcStack_48 = (connectdata *)0x0;
  bVar3 = false;
  iVar5 = IsMultiplexingPossible(data,needle);
  bVar10 = iVar5 != 0;
  cVar14 = Curl_now();
  bVar11 = false;
  if (((data->state).authhost.want & 0x28) != 0) {
    bVar11 = (needle->handler->protocol & 3) != 0;
  }
  bVar12 = false;
  if (((*(uint *)&(needle->bits).field_0x4 >> 8 & 1) != 0) &&
     (bVar12 = false, ((data->state).authproxy.want & 0x28) != 0)) {
    bVar12 = (needle->handler->protocol & 3) != 0;
  }
  *force_reuse = false;
  *waitpipe = false;
  pcVar8 = Curl_conncache_find_bundle(needle,(data->state).conn_cache);
  if (pcVar8 != (connectbundle *)0x0) {
    if ((*(uint *)&(needle->bits).field_0x4 >> 2 & 1) == 0) {
      local_a0 = (needle->host).name;
    }
    else {
      local_a0 = (needle->conn_to_host).name;
    }
    pcVar9 = "serially";
    if (pcVar8->multiuse == 2) {
      pcVar9 = "can multiplex";
    }
    Curl_infof(data,"Found bundle for host %s: %p [%s]\n",local_a0,pcVar8,pcVar9);
    if (bVar10) {
      if (pcVar8->multiuse == 0) {
        if ((pcVar8->multiuse == 0) && ((*(ulong *)&(data->set).field_0x888 >> 0x30 & 1) != 0)) {
          Curl_infof(data,"Server doesn\'t support multiplex yet, wait\n");
          *waitpipe = true;
          Curl_conncache_unlock(data);
          return false;
        }
        Curl_infof(data,"Server doesn\'t support multiplex (yet)\n");
        bVar10 = false;
      }
      if ((pcVar8->multiuse == 2) && (_Var4 = Curl_multiplex_wanted(data->multi), !_Var4)) {
        Curl_infof(data,"Could multiplex, but not asked to!\n");
        bVar10 = false;
      }
      if (pcVar8->multiuse == -1) {
        Curl_infof(data,"Can not multiplex, even if we wanted to!\n");
        bVar10 = false;
      }
    }
    pcStack_78 = (pcVar8->conn_list).head;
LAB_0012989f:
    while( true ) {
      do {
        if (pcStack_78 == (curl_llist_element *)0x0) goto LAB_0012a15a;
        bVar2 = false;
        conn = (connectdata *)pcStack_78->ptr;
        pcStack_78 = pcStack_78->next;
      } while (*(int *)&(conn->bits).field_0x4 < 0);
      now_00._12_4_ = 0;
      now_00.tv_sec = SUB128(cVar14._0_12_,0);
      now_00.tv_usec = SUB124(cVar14._0_12_,8);
      _Var4 = conn_maxage(data,conn,now_00);
      if ((!_Var4) && (_Var4 = extract_if_dead(conn,data), !_Var4)) break;
      Curl_disconnect(data,conn,true);
    }
    bVar13 = false;
    if ((conn->easyq).size != 0) {
      bVar13 = pcVar8->multiuse == 2;
    }
    if (bVar10) {
      if (((*(uint *)&(conn->bits).field_0x4 >> 0xc & 1) != 0) &&
         ((*(uint *)&(conn->bits).field_0x4 & 1) != 0)) goto LAB_0012989f;
    }
    else {
      if (bVar13) goto LAB_0012989f;
      if (conn->ip_addr_str[0] == '\0') {
        Curl_infof(data,"Connection #%ld is still name resolving, can\'t reuse\n",
                   conn->connection_id);
        goto LAB_0012989f;
      }
      if ((conn->sock[0] == -1) || ((*(uint *)&(conn->bits).field_0x4 & 1) != 0)) {
        if ((*(uint *)&(conn->bits).field_0x4 & 1) == 0) {
          bVar3 = true;
        }
        Curl_infof(data,"Connection #%ld isn\'t open enough, can\'t reuse\n",conn->connection_id);
        goto LAB_0012989f;
      }
    }
    if (needle->unix_domain_socket == (char *)0x0) {
      if (conn->unix_domain_socket != (char *)0x0) goto LAB_0012989f;
    }
    else if (((conn->unix_domain_socket == (char *)0x0) ||
             (iVar5 = strcmp(needle->unix_domain_socket,conn->unix_domain_socket), iVar5 != 0)) ||
            ((needle->field_0x640 & 1) != (conn->field_0x640 & 1))) goto LAB_0012989f;
    if ((((((needle->handler->flags & 1) == (conn->handler->flags & 1)) ||
          ((uVar6 = get_protocol_family(conn->handler->protocol), uVar6 == needle->handler->protocol
           && (((byte)conn->field_0x640 >> 1 & 1) != 0)))) &&
         ((*(uint *)&(needle->bits).field_0x4 >> 5 & 1) ==
          (*(uint *)&(conn->bits).field_0x4 >> 5 & 1))) &&
        (((*(uint *)&(needle->bits).field_0x4 >> 6 & 1) ==
          (*(uint *)&(conn->bits).field_0x4 >> 6 & 1) &&
         (((*(uint *)&(needle->bits).field_0x4 >> 6 & 1) == 0 ||
          (_Var4 = proxy_info_matches(&needle->socks_proxy,&conn->socks_proxy), _Var4)))))) &&
       (((*(uint *)&(needle->bits).field_0x4 >> 2 & 1) ==
         (*(uint *)&(conn->bits).field_0x4 >> 2 & 1) &&
        ((*(uint *)&(needle->bits).field_0x4 >> 3 & 1) ==
         (*(uint *)&(conn->bits).field_0x4 >> 3 & 1))))) {
      if ((*(uint *)&(needle->bits).field_0x4 >> 5 & 1) != 0) {
        _Var4 = proxy_info_matches(&needle->http_proxy,&conn->http_proxy);
        if ((!_Var4) ||
           ((*(uint *)&(needle->bits).field_0x4 >> 0xe & 1) !=
            (*(uint *)&(conn->bits).field_0x4 >> 0xe & 1))) goto LAB_0012989f;
        if ((needle->http_proxy).proxytype == CURLPROXY_HTTPS) {
          if ((needle->handler->flags & 1) == 0) {
            _Var4 = Curl_ssl_config_matches(&needle->ssl_config,&conn->ssl_config);
            if (!_Var4) goto LAB_0012989f;
            sVar1 = conn->ssl[0].state;
          }
          else {
            _Var4 = Curl_ssl_config_matches(&needle->proxy_ssl_config,&conn->proxy_ssl_config);
            if (!_Var4) goto LAB_0012989f;
            sVar1 = conn->proxy_ssl[0].state;
          }
          if (sVar1 != ssl_connection_complete) goto LAB_0012989f;
        }
      }
      if ((((bVar10) || (conn->data == (Curl_easy *)0x0)) &&
          (((conn->easyq).size == 0 ||
           ((conn->data == (Curl_easy *)0x0 || (conn->data->multi == needle->data->multi)))))) &&
         ((((needle->localdev == (char *)0x0 && (needle->localport == 0)) ||
           (((conn->localport == needle->localport &&
             (conn->localportrange == needle->localportrange)) &&
            ((needle->localdev == (char *)0x0 ||
             ((conn->localdev != (char *)0x0 &&
              (iVar5 = strcmp(conn->localdev,needle->localdev), iVar5 == 0)))))))) &&
          (((needle->handler->flags & 0x80) != 0 ||
           ((iVar5 = strcmp(needle->user,conn->user), iVar5 == 0 &&
            (iVar5 = strcmp(needle->passwd,conn->passwd), iVar5 == 0)))))))) {
        if (((*(uint *)&(needle->bits).field_0x4 >> 5 & 1) == 0) ||
           (((needle->handler->flags & 1) != 0 ||
            ((*(uint *)&(needle->bits).field_0x4 >> 0xe & 1) != 0)))) {
          iVar5 = Curl_strcasecompare(needle->handler->scheme,conn->handler->scheme);
          if (((iVar5 != 0) ||
              ((uVar6 = get_protocol_family(conn->handler->protocol),
               uVar6 == needle->handler->protocol && (((byte)conn->field_0x640 >> 1 & 1) != 0)))) &&
             ((((*(uint *)&(needle->bits).field_0x4 >> 2 & 1) == 0 ||
               (iVar5 = Curl_strcasecompare((needle->conn_to_host).name,(conn->conn_to_host).name),
               iVar5 != 0)) &&
              (((((*(uint *)&(needle->bits).field_0x4 >> 3 & 1) == 0 ||
                 (needle->conn_to_port == conn->conn_to_port)) &&
                (iVar5 = Curl_strcasecompare((needle->host).name,(conn->host).name), iVar5 != 0)) &&
               (needle->remote_port == conn->remote_port)))))) {
            if ((needle->handler->flags & 1) != 0) {
              _Var4 = Curl_ssl_config_matches(&needle->ssl_config,&conn->ssl_config);
              if (!_Var4) goto LAB_0012989f;
              if (conn->ssl[0].state != ssl_connection_complete) {
                bVar3 = true;
                goto LAB_0012989f;
              }
            }
            bVar2 = true;
          }
        }
        else {
          bVar2 = true;
        }
        if (bVar2) {
          if (bVar11) {
            iVar5 = strcmp(needle->user,conn->user);
            if (iVar5 != 0) goto LAB_0012989f;
            cVar7 = strcmp(needle->passwd,conn->passwd);
          }
          else {
            cVar7 = conn->http_ntlm_state;
          }
          if (cVar7 == NTLMSTATE_NONE) {
            if (bVar12) {
              if ((((conn->http_proxy).user == (char *)0x0) ||
                  ((conn->http_proxy).passwd == (char *)0x0)) ||
                 (iVar5 = strcmp((needle->http_proxy).user,(conn->http_proxy).user), iVar5 != 0))
              goto LAB_0012989f;
              cVar7 = strcmp((needle->http_proxy).passwd,(conn->http_proxy).passwd);
            }
            else {
              cVar7 = conn->proxy_ntlm_state;
            }
            if (cVar7 == NTLMSTATE_NONE) {
              pcStack_48 = conn;
              if ((!bVar11) && (!bVar12)) {
                if ((bVar10) && (bVar13)) {
                  Curl_infof(data,"Multiplexed connection found!\n");
                }
                goto LAB_0012a15a;
              }
              if (((bVar11) && (conn->http_ntlm_state != NTLMSTATE_NONE)) ||
                 ((bVar12 && (conn->proxy_ntlm_state != NTLMSTATE_NONE)))) goto LAB_0012a108;
            }
          }
        }
      }
    }
    goto LAB_0012989f;
  }
LAB_0012a15a:
  if (pcStack_48 == (connectdata *)0x0) {
    Curl_conncache_unlock(data);
    if ((bVar3) && ((*(ulong *)&(data->set).field_0x888 >> 0x30 & 1) != 0)) {
      Curl_infof(data,"Found pending candidate for reuse and CURLOPT_PIPEWAIT is set\n");
      *waitpipe = true;
    }
    data_local._7_1_ = false;
  }
  else {
    pcStack_48->data = data;
    Curl_conncache_unlock(data);
    *usethis = pcStack_48;
    data_local._7_1_ = true;
  }
  return data_local._7_1_;
LAB_0012a108:
  *force_reuse = true;
  goto LAB_0012a15a;
}

Assistant:

static bool
ConnectionExists(struct Curl_easy *data,
                 struct connectdata *needle,
                 struct connectdata **usethis,
                 bool *force_reuse,
                 bool *waitpipe)
{
  struct connectdata *check;
  struct connectdata *chosen = 0;
  bool foundPendingCandidate = FALSE;
  bool canmultiplex = IsMultiplexingPossible(data, needle);
  struct connectbundle *bundle;
  struct curltime now = Curl_now();

#ifdef USE_NTLM
  bool wantNTLMhttp = ((data->state.authhost.want &
                      (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
                      (needle->handler->protocol & PROTO_FAMILY_HTTP));
  bool wantProxyNTLMhttp = (needle->bits.proxy_user_passwd &&
                           ((data->state.authproxy.want &
                           (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
                           (needle->handler->protocol & PROTO_FAMILY_HTTP)));
#endif

  *force_reuse = FALSE;
  *waitpipe = FALSE;

  /* Look up the bundle with all the connections to this particular host.
     Locks the connection cache, beware of early returns! */
  bundle = Curl_conncache_find_bundle(needle, data->state.conn_cache);
  if(bundle) {
    /* Max pipe length is zero (unlimited) for multiplexed connections */
    struct curl_llist_element *curr;

    infof(data, "Found bundle for host %s: %p [%s]\n",
          (needle->bits.conn_to_host ? needle->conn_to_host.name :
           needle->host.name), (void *)bundle,
          (bundle->multiuse == BUNDLE_MULTIPLEX ?
           "can multiplex" : "serially"));

    /* We can't multiplex if we don't know anything about the server */
    if(canmultiplex) {
      if(bundle->multiuse == BUNDLE_UNKNOWN) {
        if((bundle->multiuse == BUNDLE_UNKNOWN) && data->set.pipewait) {
          infof(data, "Server doesn't support multiplex yet, wait\n");
          *waitpipe = TRUE;
          Curl_conncache_unlock(data);
          return FALSE; /* no re-use */
        }

        infof(data, "Server doesn't support multiplex (yet)\n");
        canmultiplex = FALSE;
      }
      if((bundle->multiuse == BUNDLE_MULTIPLEX) &&
         !Curl_multiplex_wanted(data->multi)) {
        infof(data, "Could multiplex, but not asked to!\n");
        canmultiplex = FALSE;
      }
      if(bundle->multiuse == BUNDLE_NO_MULTIUSE) {
        infof(data, "Can not multiplex, even if we wanted to!\n");
        canmultiplex = FALSE;
      }
    }

    curr = bundle->conn_list.head;
    while(curr) {
      bool match = FALSE;
      size_t multiplexed;

      /*
       * Note that if we use a HTTP proxy in normal mode (no tunneling), we
       * check connections to that proxy and not to the actual remote server.
       */
      check = curr->ptr;
      curr = curr->next;

      if(check->bits.connect_only)
        /* connect-only connections will not be reused */
        continue;

      if(conn_maxage(data, check, now) || extract_if_dead(check, data)) {
        /* disconnect it */
        (void)Curl_disconnect(data, check, /* dead_connection */TRUE);
        continue;
      }

      multiplexed = CONN_INUSE(check) &&
        (bundle->multiuse == BUNDLE_MULTIPLEX);

      if(canmultiplex) {
        if(check->bits.protoconnstart && check->bits.close)
          continue;
      }
      else {
        if(multiplexed) {
          /* can only happen within multi handles, and means that another easy
             handle is using this connection */
          continue;
        }

        if(Curl_resolver_asynch()) {
          /* ip_addr_str[0] is NUL only if the resolving of the name hasn't
             completed yet and until then we don't re-use this connection */
          if(!check->ip_addr_str[0]) {
            infof(data,
                  "Connection #%ld is still name resolving, can't reuse\n",
                  check->connection_id);
            continue;
          }
        }

        if((check->sock[FIRSTSOCKET] == CURL_SOCKET_BAD) ||
           check->bits.close) {
          if(!check->bits.close)
            foundPendingCandidate = TRUE;
          /* Don't pick a connection that hasn't connected yet or that is going
             to get closed. */
          infof(data, "Connection #%ld isn't open enough, can't reuse\n",
                check->connection_id);
          continue;
        }
      }

#ifdef USE_UNIX_SOCKETS
      if(needle->unix_domain_socket) {
        if(!check->unix_domain_socket)
          continue;
        if(strcmp(needle->unix_domain_socket, check->unix_domain_socket))
          continue;
        if(needle->abstract_unix_socket != check->abstract_unix_socket)
          continue;
      }
      else if(check->unix_domain_socket)
        continue;
#endif

      if((needle->handler->flags&PROTOPT_SSL) !=
         (check->handler->flags&PROTOPT_SSL))
        /* don't do mixed SSL and non-SSL connections */
        if(get_protocol_family(check->handler->protocol) !=
           needle->handler->protocol || !check->tls_upgraded)
          /* except protocols that have been upgraded via TLS */
          continue;

      if(needle->bits.httpproxy != check->bits.httpproxy ||
         needle->bits.socksproxy != check->bits.socksproxy)
        continue;

      if(needle->bits.socksproxy && !proxy_info_matches(&needle->socks_proxy,
                                                        &check->socks_proxy))
        continue;

      if(needle->bits.conn_to_host != check->bits.conn_to_host)
        /* don't mix connections that use the "connect to host" feature and
         * connections that don't use this feature */
        continue;

      if(needle->bits.conn_to_port != check->bits.conn_to_port)
        /* don't mix connections that use the "connect to port" feature and
         * connections that don't use this feature */
        continue;

      if(needle->bits.httpproxy) {
        if(!proxy_info_matches(&needle->http_proxy, &check->http_proxy))
          continue;

        if(needle->bits.tunnel_proxy != check->bits.tunnel_proxy)
          continue;

        if(needle->http_proxy.proxytype == CURLPROXY_HTTPS) {
          /* use https proxy */
          if(needle->handler->flags&PROTOPT_SSL) {
            /* use double layer ssl */
            if(!Curl_ssl_config_matches(&needle->proxy_ssl_config,
                                        &check->proxy_ssl_config))
              continue;
            if(check->proxy_ssl[FIRSTSOCKET].state != ssl_connection_complete)
              continue;
          }
          else {
            if(!Curl_ssl_config_matches(&needle->ssl_config,
                                        &check->ssl_config))
              continue;
            if(check->ssl[FIRSTSOCKET].state != ssl_connection_complete)
              continue;
          }
        }
      }

      if(!canmultiplex && check->data)
        /* this request can't be multiplexed but the checked connection is
           already in use so we skip it */
        continue;

      if(CONN_INUSE(check) && check->data &&
         (check->data->multi != needle->data->multi))
        /* this could be subject for multiplex use, but only if they belong to
         * the same multi handle */
        continue;

      if(needle->localdev || needle->localport) {
        /* If we are bound to a specific local end (IP+port), we must not
           re-use a random other one, although if we didn't ask for a
           particular one we can reuse one that was bound.

           This comparison is a bit rough and too strict. Since the input
           parameters can be specified in numerous ways and still end up the
           same it would take a lot of processing to make it really accurate.
           Instead, this matching will assume that re-uses of bound connections
           will most likely also re-use the exact same binding parameters and
           missing out a few edge cases shouldn't hurt anyone very much.
        */
        if((check->localport != needle->localport) ||
           (check->localportrange != needle->localportrange) ||
           (needle->localdev &&
            (!check->localdev || strcmp(check->localdev, needle->localdev))))
          continue;
      }

      if(!(needle->handler->flags & PROTOPT_CREDSPERREQUEST)) {
        /* This protocol requires credentials per connection,
           so verify that we're using the same name and password as well */
        if(strcmp(needle->user, check->user) ||
           strcmp(needle->passwd, check->passwd)) {
          /* one of them was different */
          continue;
        }
      }

      if(!needle->bits.httpproxy || (needle->handler->flags&PROTOPT_SSL) ||
         needle->bits.tunnel_proxy) {
        /* The requested connection does not use a HTTP proxy or it uses SSL or
           it is a non-SSL protocol tunneled or it is a non-SSL protocol which
           is allowed to be upgraded via TLS */

        if((strcasecompare(needle->handler->scheme, check->handler->scheme) ||
            (get_protocol_family(check->handler->protocol) ==
             needle->handler->protocol && check->tls_upgraded)) &&
           (!needle->bits.conn_to_host || strcasecompare(
            needle->conn_to_host.name, check->conn_to_host.name)) &&
           (!needle->bits.conn_to_port ||
             needle->conn_to_port == check->conn_to_port) &&
           strcasecompare(needle->host.name, check->host.name) &&
           needle->remote_port == check->remote_port) {
          /* The schemes match or the the protocol family is the same and the
             previous connection was TLS upgraded, and the hostname and host
             port match */
          if(needle->handler->flags & PROTOPT_SSL) {
            /* This is a SSL connection so verify that we're using the same
               SSL options as well */
            if(!Curl_ssl_config_matches(&needle->ssl_config,
                                        &check->ssl_config)) {
              DEBUGF(infof(data,
                           "Connection #%ld has different SSL parameters, "
                           "can't reuse\n",
                           check->connection_id));
              continue;
            }
            if(check->ssl[FIRSTSOCKET].state != ssl_connection_complete) {
              foundPendingCandidate = TRUE;
              DEBUGF(infof(data,
                           "Connection #%ld has not started SSL connect, "
                           "can't reuse\n",
                           check->connection_id));
              continue;
            }
          }
          match = TRUE;
        }
      }
      else {
        /* The requested connection is using the same HTTP proxy in normal
           mode (no tunneling) */
        match = TRUE;
      }

      if(match) {
#if defined(USE_NTLM)
        /* If we are looking for an HTTP+NTLM connection, check if this is
           already authenticating with the right credentials. If not, keep
           looking so that we can reuse NTLM connections if
           possible. (Especially we must not reuse the same connection if
           partway through a handshake!) */
        if(wantNTLMhttp) {
          if(strcmp(needle->user, check->user) ||
             strcmp(needle->passwd, check->passwd))
            continue;
        }
        else if(check->http_ntlm_state != NTLMSTATE_NONE) {
          /* Connection is using NTLM auth but we don't want NTLM */
          continue;
        }

        /* Same for Proxy NTLM authentication */
        if(wantProxyNTLMhttp) {
          /* Both check->http_proxy.user and check->http_proxy.passwd can be
           * NULL */
          if(!check->http_proxy.user || !check->http_proxy.passwd)
            continue;

          if(strcmp(needle->http_proxy.user, check->http_proxy.user) ||
             strcmp(needle->http_proxy.passwd, check->http_proxy.passwd))
            continue;
        }
        else if(check->proxy_ntlm_state != NTLMSTATE_NONE) {
          /* Proxy connection is using NTLM auth but we don't want NTLM */
          continue;
        }

        if(wantNTLMhttp || wantProxyNTLMhttp) {
          /* Credentials are already checked, we can use this connection */
          chosen = check;

          if((wantNTLMhttp &&
             (check->http_ntlm_state != NTLMSTATE_NONE)) ||
              (wantProxyNTLMhttp &&
               (check->proxy_ntlm_state != NTLMSTATE_NONE))) {
            /* We must use this connection, no other */
            *force_reuse = TRUE;
            break;
          }

          /* Continue look up for a better connection */
          continue;
        }
#endif
        if(canmultiplex) {
          /* We can multiplex if we want to. Let's continue looking for
             the optimal connection to use. */

          if(!multiplexed) {
            /* We have the optimal connection. Let's stop looking. */
            chosen = check;
            break;
          }

#ifdef USE_NGHTTP2
          /* If multiplexed, make sure we don't go over concurrency limit */
          if(check->bits.multiplex) {
            /* Multiplexed connections can only be HTTP/2 for now */
            struct http_conn *httpc = &check->proto.httpc;
            if(multiplexed >= httpc->settings.max_concurrent_streams) {
              infof(data, "MAX_CONCURRENT_STREAMS reached, skip (%zu)\n",
                    multiplexed);
              continue;
            }
          }
#endif
          /* When not multiplexed, we have a match here! */
          chosen = check;
          infof(data, "Multiplexed connection found!\n");
          break;
        }
        else {
          /* We have found a connection. Let's stop searching. */
          chosen = check;
          break;
        }
      }
    }
  }

  if(chosen) {
    /* mark it as used before releasing the lock */
    chosen->data = data; /* own it! */
    Curl_conncache_unlock(data);
    *usethis = chosen;
    return TRUE; /* yes, we found one to use! */
  }
  Curl_conncache_unlock(data);

  if(foundPendingCandidate && data->set.pipewait) {
    infof(data,
          "Found pending candidate for reuse and CURLOPT_PIPEWAIT is set\n");
    *waitpipe = TRUE;
  }

  return FALSE; /* no matching connecting exists */
}